

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

Options * __thiscall S2BooleanOperation::Options::operator=(Options *this,Options *options)

{
  pointer pSVar1;
  unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_> local_20;
  Options *local_18;
  Options *options_local;
  Options *this_local;
  
  local_18 = options;
  options_local = this;
  pSVar1 = std::unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>::
           operator->(&options->snap_function_);
  (*pSVar1->_vptr_SnapFunction[6])(&local_20);
  std::unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>::operator=
            (&this->snap_function_,&local_20);
  std::unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>::
  ~unique_ptr(&local_20);
  this->polygon_model_ = local_18->polygon_model_;
  this->polyline_model_ = local_18->polyline_model_;
  this->polyline_loops_have_boundaries_ = (bool)(local_18->polyline_loops_have_boundaries_ & 1);
  this->precision_ = local_18->precision_;
  this->conservative_output_ = (bool)(local_18->conservative_output_ & 1);
  this->source_id_lexicon_ = local_18->source_id_lexicon_;
  return this;
}

Assistant:

S2BooleanOperation::Options& S2BooleanOperation::Options::operator=(
    const Options& options) {
  snap_function_ = options.snap_function_->Clone();
  polygon_model_ = options.polygon_model_;
  polyline_model_ = options.polyline_model_;
  polyline_loops_have_boundaries_ = options.polyline_loops_have_boundaries_;
  precision_ = options.precision_;
  conservative_output_ = options.conservative_output_;
  source_id_lexicon_ = options.source_id_lexicon_;
  return *this;
}